

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# orphan-test.c++
# Opt level: O3

void __thiscall capnp::_::anon_unknown_0::TestCase812::run(TestCase812 *this)

{
  Reader reader;
  Builder builder_00;
  PointerType PVar1;
  Builder root;
  Builder child;
  MallocMessageBuilder builder;
  StructBuilder in_stack_000002e0;
  OrphanBuilder local_208;
  OrphanBuilder local_1e8;
  StructBuilder local_1c8;
  StructBuilder local_198;
  StructBuilder local_170;
  SegmentReader *local_148;
  CapTableReader *pCStack_140;
  void *local_138;
  WirePointer *pWStack_130;
  StructDataBitCount local_128;
  StructPointerCount SStack_124;
  undefined2 uStack_122;
  undefined8 in_stack_fffffffffffffee0;
  SegmentBuilder *in_stack_fffffffffffffee8;
  CapTableBuilder *in_stack_fffffffffffffef0;
  WirePointer *in_stack_fffffffffffffef8;
  _func_int **in_stack_ffffffffffffff00;
  
  MallocMessageBuilder::MallocMessageBuilder
            ((MallocMessageBuilder *)&stack0xffffffffffffff00,0,FIXED_SIZE);
  MessageBuilder::getRootInternal((Builder *)&local_1e8,(MessageBuilder *)&stack0xffffffffffffff00);
  local_198.data = local_1e8.capTable;
  local_198.segment = (SegmentBuilder *)local_1e8.tag.content;
  local_198.capTable = (CapTableBuilder *)local_1e8.segment;
  PointerBuilder::initStruct(&local_1c8,(PointerBuilder *)&local_198,(StructSize)0x140006);
  local_1e8.capTable = (CapTableBuilder *)(local_1c8.pointers + 2);
  local_1e8.tag.content = (uint64_t)local_1c8.segment;
  local_1e8.segment = (SegmentBuilder *)local_1c8.capTable;
  PointerBuilder::initStruct(&local_198,(PointerBuilder *)&local_1e8,(StructSize)0x140006);
  builder_00._builder.capTable = (CapTableBuilder *)in_stack_fffffffffffffee8;
  builder_00._builder.segment = (SegmentBuilder *)in_stack_fffffffffffffee0;
  builder_00._builder.data = in_stack_fffffffffffffef0;
  builder_00._builder.pointers = in_stack_fffffffffffffef8;
  builder_00._builder._32_8_ = in_stack_ffffffffffffff00;
  initTestMessage(builder_00);
  PointerBuilder::disown(&local_1e8,(PointerBuilder *)&stack0xfffffffffffffee8);
  local_208.segment = local_1e8.segment;
  local_208.capTable = local_1e8.capTable;
  local_208.location = local_1e8.location;
  local_208.tag.content = local_1e8.tag.content;
  local_1e8.capTable = (CapTableBuilder *)(local_1c8.pointers + 2);
  local_1e8.tag.content = (uint64_t)local_1c8.segment;
  local_1e8.segment = (SegmentBuilder *)local_1c8.capTable;
  PVar1 = PointerBuilder::getPointerType((PointerBuilder *)&local_1e8);
  if (PVar1 != NULL_ && kj::_::Debug::minSeverity < 3) {
    kj::_::Debug::log<char_const(&)[42]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x333,ERROR,"\"failed: expected \" \"!(root.hasStructField())\"",
               (char (*) [42])"failed: expected !(root.hasStructField())");
    local_1e8.location = local_208.location;
  }
  if ((local_1e8.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
    kj::_::Debug::log<char_const(&)[35]>
              ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
               ,0x334,ERROR,"\"failed: expected \" \"orphan != nullptr\"",
               (char (*) [35])"failed: expected orphan != nullptr");
    if ((local_208.location == (word *)0x0) && (kj::_::Debug::minSeverity < 3)) {
      kj::_::Debug::log<char_const(&)[38]>
                ("/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/orphan-test.c++"
                 ,0x335,ERROR,"\"failed: expected \" \"!(orphan == nullptr)\"",
                 (char (*) [38])"failed: expected !(orphan == nullptr)");
    }
  }
  OrphanBuilder::asStructReader((StructReader *)&local_148,&local_208,(StructSize)0x140006);
  reader._reader.capTable = pCStack_140;
  reader._reader.segment = local_148;
  reader._reader.data = local_138;
  reader._reader.pointers = pWStack_130;
  reader._reader.dataSize = local_128;
  reader._reader.pointerCount = SStack_124;
  reader._reader._38_2_ = uStack_122;
  reader._reader.nestingLimit = (int)in_stack_fffffffffffffee0;
  reader._reader._44_4_ = SUB84(in_stack_fffffffffffffee0,4);
  checkTestMessage(reader);
  OrphanBuilder::asStruct(&local_170,&local_208,(StructSize)0x140006);
  checkTestMessage((Builder)in_stack_000002e0);
  if (local_208.segment != (SegmentBuilder *)0x0) {
    OrphanBuilder::euthanize(&local_208);
  }
  MallocMessageBuilder::~MallocMessageBuilder((MallocMessageBuilder *)&stack0xffffffffffffff00);
  return;
}

Assistant:

TEST(Orphans, FarPointer) {
  MallocMessageBuilder builder(0, AllocationStrategy::FIXED_SIZE);
  auto root = builder.initRoot<TestAllTypes>();
  auto child = root.initStructField();
  initTestMessage(child);

  auto orphan = root.disownStructField();
  EXPECT_FALSE(root.hasStructField());
  EXPECT_TRUE(orphan != nullptr);
  EXPECT_FALSE(orphan == nullptr);

  checkTestMessage(orphan.getReader());
  checkTestMessage(orphan.get());
}